

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O3

MutSuffix __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::Find
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name)

{
  iterator iVar1;
  SuffixBase SVar2;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_60._8_8_ = name.size_;
  local_60._0_8_ = name.data_;
  local_70[0] = 0;
  local_60._16_4_ = 0;
  local_60._20_4_ = 0;
  local_60._24_8_ = (void *)0x0;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_70,local_70);
  iVar1 = std::
          _Rb_tree<mp::internal::SuffixBase::Impl,_mp::internal::SuffixBase::Impl,_std::_Identity<mp::internal::SuffixBase::Impl>,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
          ::find(&(this->set_)._M_t,(key_type *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  SVar2.impl_ = (Impl *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->set_)._M_t._M_impl.super__Rb_tree_header) {
    SVar2.impl_ = (Impl *)(iVar1._M_node + 1);
  }
  return (MutSuffix)SVar2.impl_;
}

Assistant:

MutSuffix Find(fmt::StringRef name) {
    typename Set::iterator i = set_.find(SuffixImpl(name));
    return MutSuffix(i != set_.end() ? &*i : 0);
  }